

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     Finalize<duckdb::ArgMinMaxState<int,double>,int,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  idx_t iVar4;
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (*states == (Vector)0x2) {
    duckdb::Vector::SetVectorType((VectorType)result);
    local_48.result_idx = 0;
    pcVar1 = (char *)**(undefined8 **)(states + 0x20);
    if ((*pcVar1 == '\x01') && (pcVar1[1] != '\x01')) {
      **(undefined4 **)(result + 0x20) = *(undefined4 *)(pcVar1 + 4);
    }
    else {
      AggregateFinalizeData::ReturnNull(&local_48);
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    lVar2 = *(long *)(states + 0x20);
    lVar3 = *(long *)(result + 0x20);
    if (count != 0) {
      iVar4 = 0;
      do {
        local_48.result_idx = offset + iVar4;
        pcVar1 = *(char **)(lVar2 + iVar4 * 8);
        if ((*pcVar1 == '\x01') && (pcVar1[1] != '\x01')) {
          *(undefined4 *)(lVar3 + offset * 4 + iVar4 * 4) = *(undefined4 *)(pcVar1 + 4);
        }
        else {
          AggregateFinalizeData::ReturnNull(&local_48);
        }
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}